

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturetests.cc
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_c633::ktxTexture1TestBase::compareTexture
          (ktxTexture1TestBase *this,ktxTexture1 *texture)

{
  int iVar1;
  long in_RSI;
  long in_RDI;
  bool local_1;
  
  if (*(int *)(in_RSI + 0x7c) == **(int **)(in_RDI + 0x180)) {
    if (*(int *)(in_RSI + 0x80) == *(int *)(*(long *)(in_RDI + 0x180) + 0x3c)) {
      if (*(int *)(in_RSI + 0x78) == *(int *)(*(long *)(in_RDI + 0x180) + 0x38)) {
        if (*(int *)(in_RSI + 0x84) == *(int *)(*(long *)(in_RDI + 0x180) + 0x34)) {
          iVar1 = ktxTexture1_glTypeSize(in_RSI);
          if (iVar1 == *(int *)(*(long *)(in_RDI + 0x180) + 0x30)) {
            if (*(int *)(in_RSI + 0x24) == *(int *)(*(long *)(in_RDI + 0x180) + 0x10)) {
              if (*(int *)(*(long *)(in_RDI + 0x180) + 0x14) == 0) {
                if (*(int *)(in_RSI + 0x28) != 1) {
                  return false;
                }
              }
              else if (*(int *)(in_RSI + 0x28) != *(int *)(*(long *)(in_RDI + 0x180) + 0x14)) {
                return false;
              }
              if (*(int *)(*(long *)(in_RDI + 0x180) + 0x18) == 0) {
                if (*(int *)(in_RSI + 0x2c) != 1) {
                  return false;
                }
              }
              else if (*(int *)(in_RSI + 0x2c) != *(int *)(*(long *)(in_RDI + 0x180) + 0x18)) {
                return false;
              }
              if (*(int *)(in_RSI + 0x3c) == *(int *)(*(long *)(in_RDI + 0x180) + 0x28)) {
                if (*(int *)(in_RSI + 0x34) == *(int *)(*(long *)(in_RDI + 0x180) + 0x20)) {
                  local_1 = true;
                }
                else {
                  local_1 = false;
                }
              }
              else {
                local_1 = false;
              }
            }
            else {
              local_1 = false;
            }
          }
          else {
            local_1 = false;
          }
        }
        else {
          local_1 = false;
        }
      }
      else {
        local_1 = false;
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool
    compareTexture(ktxTexture1* texture)
    {
        if (texture->glInternalformat != texinfo.glInternalformat)
            return false;
        if (texture->glBaseInternalformat != texinfo.glBaseInternalformat)
            return false;
        if (texture->glFormat != texinfo.glFormat)
            return false;
        if (texture->glType != texinfo.glType)
            return false;
        if (ktxTexture1_glTypeSize(texture) != texinfo.glTypeSize)
            return false;
        if (texture->baseWidth != texinfo.baseWidth)
            return false;
        if (texinfo.baseHeight == 0) {
            if (texture->baseHeight != 1)
                return false;
        } else if (texture->baseHeight != texinfo.baseHeight)
            return false;
        if (texinfo.baseDepth == 0) {
            if (texture->baseDepth != 1)
                return false;
        } else if (texture->baseDepth != texinfo.baseDepth)
            return false;
        if (texture->numFaces != texinfo.numFaces)
            return false;
        if (texture->numLevels != texinfo.numLevels)
            return false;
        return true;
    }